

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O3

PmError alsa_write_short(PmInternal *midi,PmEvent *event)

{
  uint uVar1;
  undefined1 *puVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  
  uVar3 = event->message;
  uVar1 = uVar3 & 0xff;
  if (uVar1 < 0x80) {
    pvVar5 = midi->descriptor;
    if (pvVar5 == (void *)0x0) {
      return pmBadPtr;
    }
  }
  else {
    if (uVar1 < 0xf0) {
      uVar1 = uVar1 - 0x80 >> 4;
      puVar2 = midi_message_length_length;
    }
    else {
      uVar1 = uVar1 - 0xf0;
      puVar2 = midi_message_length_length_7;
    }
    pvVar5 = midi->descriptor;
    if (pvVar5 == (void *)0x0) {
      return pmBadPtr;
    }
    iVar4 = *(int *)(puVar2 + (ulong)uVar1 * 4);
    if (0 < iVar4) {
      do {
        alsa_write_byte(midi,(uchar)uVar3,event->timestamp);
        if (*(int *)((long)pvVar5 + 0x18) < 0) {
          return pmHostError;
        }
        uVar3 = (int)uVar3 >> 8;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      goto LAB_00104948;
    }
  }
  if (*(int *)((long)pvVar5 + 0x18) < 0) {
    return pmHostError;
  }
LAB_00104948:
  *(undefined4 *)((long)pvVar5 + 0x18) = 0;
  return pmNoData;
}

Assistant:

static PmError alsa_write_short(PmInternal *midi, PmEvent *event)
{
    int bytes = midi_message_length(event->message);
    PmMessage msg = event->message;
    int i;
    alsa_descriptor_type desc = (alsa_descriptor_type) midi->descriptor;
    if (!desc) return pmBadPtr;
    for (i = 0; i < bytes; i++) {
        unsigned char byte = msg;
        VERBOSE printf("sending 0x%x\n", byte);
        alsa_write_byte(midi, byte, event->timestamp);
        if (desc->error < 0) break;
        msg >>= 8; /* shift next byte into position */
    }
    if (desc->error < 0) return pmHostError;
    desc->error = pmNoError;
    return pmNoError;
}